

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  invalid_argument *piVar6;
  Compression compression;
  int iVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  Compression c;
  vector<const_char_*,_std::allocator<const_char_*>_> inFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  views;
  stringstream e;
  allocator<char> local_25d;
  int local_25c;
  char *local_258;
  Compression local_24c;
  vector<const_char_*,_std::allocator<const_char_*>_> local_248;
  undefined8 local_228;
  char **local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  allocator<char> local_1d8 [32];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (char **)0x0;
  local_248.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (char **)0x0;
  if (argc < 2) {
    iVar2 = -1;
    anon_unknown.dwarf_feca::usageMessage((ostream *)&std::cerr,*argv,false);
LAB_001048d6:
    if (local_248.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_248.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
    return iVar2;
  }
  local_25c = argc + -2;
  compression = PIZ_COMPRESSION;
  uVar8 = 1;
  local_258 = (char *)0x0;
  local_228 = 0;
  local_220 = argv;
LAB_0010453b:
  iVar7 = (int)uVar8;
  ppcVar1 = local_220 + uVar8;
  pcVar3 = *ppcVar1;
  iVar2 = strcmp(pcVar3,"-z");
  if (iVar2 == 0) {
    if (local_25c < iVar7) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Missing compression value with -z option");
      goto LAB_001049e4;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,ppcVar1[1],&local_25d);
    Imf_3_4::getCompressionIdFromName((string *)&local_1f8,&local_24c);
    compression = local_24c;
    if (local_24c == NUM_COMPRESSION_METHODS) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"Unknown compression method \"",0x1c);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b8 + 0x10),(char *)local_1f8,local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(piVar6,(string *)local_1d8);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
LAB_00104641:
    iVar9 = 2;
  }
  else {
    iVar2 = strcmp(pcVar3,"-v");
    iVar9 = 1;
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar3,"-h");
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar3,"--help");
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar3,"--version");
          if (iVar2 == 0) {
            pcVar3 = (char *)Imf_3_4::getLibraryVersion();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"exrmultiview (OpenEXR) ",0x17);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.4.0",5);
            iVar2 = strcmp(pcVar3,"3.4.0");
            if (iVar2 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"(OpenEXR version ",0x11);
              if (pcVar3 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10a1a8);
              }
              else {
                sVar4 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar3,sVar4);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout," https://openexr.com",0x14);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Copyright (c) Contributors to the OpenEXR Project",
                       0x31);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"License BSD-3-Clause",0x14);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            std::ostream::flush();
            goto LAB_001048d4;
          }
          if ((iVar7 <= local_25c) && (*ppcVar1[1] != '-')) {
            std::__cxx11::string::string<std::allocator<char>>((string *)local_1b8,pcVar3,local_1d8)
            ;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_218,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8);
            if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
              operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
            }
            if (local_248.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_248.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *local_248.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_finish = ppcVar1[1];
              local_248.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_248.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
              goto LAB_00104641;
            }
            iVar9 = 2;
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>
                      ((vector<char_const*,std::allocator<char_const*>> *)&local_248,
                       (iterator)
                       local_248.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,ppcVar1 + 1);
            goto LAB_00104650;
          }
          bVar10 = local_258 != (char *)0x0;
          local_258 = pcVar3;
          if (bVar10) {
            piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(piVar6,"improper output file specified");
            goto LAB_001049e4;
          }
          goto LAB_00104650;
        }
      }
      anon_unknown.dwarf_feca::usageMessage((ostream *)&std::cout,"exrmultiview",true);
      goto LAB_001048d4;
    }
    local_228 = CONCAT71((int7)(CONCAT44(extraout_var,iVar2) >> 8),1);
  }
LAB_00104650:
  uVar8 = (ulong)(uint)(iVar7 + iVar9);
  if (argc <= iVar7 + iVar9) goto LAB_001046ec;
  goto LAB_0010453b;
LAB_001046ec:
  if ((ulong)((long)local_218.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_218.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Must specify at least two views");
  }
  else {
    if (local_258 != (char *)0x0) {
      makeMultiView(&local_218,&local_248,local_258,compression,(bool)((byte)local_228 & 1));
LAB_001048d4:
      iVar2 = 0;
      goto LAB_001048d6;
    }
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Must specify an output file");
  }
LAB_001049e4:
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int
main (int argc, char** argv)
{
    vector<string>      views;
    vector<const char*> inFiles;
    const char*         outFile     = 0;
    Compression         compression = PIZ_COMPRESSION;
    bool                verbose     = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    try
    {

        int i = 1;

        while (i < argc)
        {
            if (!strcmp (argv[i], "-z"))
            {
                //
                // Set compression method
                //

                if (i > argc - 2)
                    throw invalid_argument (
                        "Missing compression value with -z option");

                compression = getCompression (argv[i + 1]);
                i += 2;
            }
            else if (!strcmp (argv[i], "-v"))
            {
                //
                // Verbose mode
                //

                verbose = true;
                i += 1;
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                //
                // Print help message
                //

                usageMessage (cout, "exrmultiview", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion ();

                cout << "exrmultiview (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project"
                     << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }
            else
            {
                //
                // View or image file name
                //

                if (i > argc - 2 || argv[i + 1][0] == '-')
                {
                    //
                    // Output file
                    //

                    if (outFile)
                        throw invalid_argument (
                            "improper output file specified");

                    outFile = argv[i];
                    i += 1;
                }
                else
                {
                    //
                    // View plus input file
                    //

                    views.push_back (argv[i]);
                    inFiles.push_back (argv[i + 1]);
                    i += 2;
                }
            }
        }

        if (views.size () < 2)
            throw invalid_argument ("Must specify at least two views");

        if (outFile == 0)
            throw invalid_argument ("Must specify an output file");

        //
        // Load inFiles, and save a combined multi-view image in outFile.
        //

        makeMultiView (views, inFiles, outFile, compression, verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return -1;
    }

    return 0;
}